

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mutex_stats_init_cols
               (emitter_row_t *row,char *table_name,emitter_col_t *name,emitter_col_t *col_uint64_t,
               emitter_col_t *col_uint32_t)

{
  emitter_col_t *in_RCX;
  emitter_col_t *in_RDX;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 in_RSI;
  emitter_row_t *in_RDI;
  emitter_col_t *in_R8;
  emitter_col_t *col;
  mutex_prof_uint32_t_counter_ind_t k_uint32_t;
  mutex_prof_uint64_t_counter_ind_t k_uint64_t;
  
  if (in_RDX != (emitter_col_t *)0x0) {
    emitter_col_init(in_RDX,in_RDI);
    in_RDX->justify = emitter_justify_left;
    in_RDX->width = 0x15;
    in_RDX->type = emitter_type_title;
    in_RDX->field_3 = in_RSI;
  }
  emitter_col_init(in_RCX,in_RDI);
  in_RCX->justify = emitter_justify_right;
  in_RCX->width = 0x10;
  in_RCX->type = emitter_type_title;
  (in_RCX->field_3).str_val = "n_lock_ops";
  emitter_col_init(in_RCX + 1,in_RDI);
  in_RCX[1].justify = emitter_justify_right;
  in_RCX[1].width = 8;
  in_RCX[1].type = emitter_type_title;
  in_RCX[1].field_3.str_val = "(#/sec)";
  emitter_col_init(in_RCX + 2,in_RDI);
  in_RCX[2].justify = emitter_justify_right;
  in_RCX[2].width = 0x10;
  in_RCX[2].type = emitter_type_title;
  in_RCX[2].field_3.str_val = "n_waiting";
  emitter_col_init(in_RCX + 3,in_RDI);
  in_RCX[3].justify = emitter_justify_right;
  in_RCX[3].width = 8;
  in_RCX[3].type = emitter_type_title;
  in_RCX[3].field_3.str_val = "(#/sec)";
  emitter_col_init(in_RCX + 4,in_RDI);
  in_RCX[4].justify = emitter_justify_right;
  in_RCX[4].width = 0x10;
  in_RCX[4].type = emitter_type_title;
  in_RCX[4].field_3.str_val = "n_spin_acq";
  emitter_col_init(in_RCX + 5,in_RDI);
  in_RCX[5].justify = emitter_justify_right;
  in_RCX[5].width = 8;
  in_RCX[5].type = emitter_type_title;
  in_RCX[5].field_3.str_val = "(#/sec)";
  emitter_col_init(in_RCX + 6,in_RDI);
  in_RCX[6].justify = emitter_justify_right;
  in_RCX[6].width = 0x10;
  in_RCX[6].type = emitter_type_title;
  in_RCX[6].field_3.str_val = "n_owner_switch";
  emitter_col_init(in_RCX + 7,in_RDI);
  in_RCX[7].justify = emitter_justify_right;
  in_RCX[7].width = 8;
  in_RCX[7].type = emitter_type_title;
  in_RCX[7].field_3.str_val = "(#/sec)";
  emitter_col_init(in_RCX + 8,in_RDI);
  in_RCX[8].justify = emitter_justify_right;
  in_RCX[8].width = 0x10;
  in_RCX[8].type = emitter_type_title;
  in_RCX[8].field_3.str_val = "total_wait_ns";
  emitter_col_init(in_RCX + 9,in_RDI);
  in_RCX[9].justify = emitter_justify_right;
  in_RCX[9].width = 8;
  in_RCX[9].type = emitter_type_title;
  in_RCX[9].field_3.str_val = "(#/sec)";
  emitter_col_init(in_RCX + 10,in_RDI);
  in_RCX[10].justify = emitter_justify_right;
  in_RCX[10].width = 0x10;
  in_RCX[10].type = emitter_type_title;
  in_RCX[10].field_3.str_val = "max_wait_ns";
  emitter_col_init(in_R8,in_RDI);
  in_R8->justify = emitter_justify_right;
  in_R8->width = 0xc;
  in_R8->type = emitter_type_title;
  (in_R8->field_3).str_val = "max_n_thds";
  in_RCX[9].width = 10;
  return;
}

Assistant:

static void
mutex_stats_init_cols(emitter_row_t *row, const char *table_name,
    emitter_col_t *name,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

	if (name != NULL) {
		emitter_col_init(name, row);
		name->justify = emitter_justify_left;
		name->width = 21;
		name->type = emitter_type_title;
		name->str_val = table_name;
	}

#define WIDTH_uint32_t 12
#define WIDTH_uint64_t 16
#define OP(counter, counter_type, human, derived, base_counter)	\
	col = &col_##counter_type[k_##counter_type];			\
	++k_##counter_type;						\
	emitter_col_init(col, row);					\
	col->justify = emitter_justify_right;				\
	col->width = derived ? 8 : WIDTH_##counter_type;		\
	col->type = emitter_type_title;					\
	col->str_val = human;
	MUTEX_PROF_COUNTERS
#undef OP
#undef WIDTH_uint32_t
#undef WIDTH_uint64_t
	col_uint64_t[mutex_counter_total_wait_time_ps].width = 10;
}